

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  socklen_t __optlen;
  int iVar1;
  timeval *__optval;
  int __optname;
  int value_local;
  timeval timeVal;
  
  iVar1 = -1;
  value_local = value;
  switch(option) {
  case ENET_SOCKOPT_NONBLOCK:
    iVar1 = ioctl(socket,0x5421,&value_local);
    goto switchD_0015b7b4_caseD_8;
  case ENET_SOCKOPT_BROADCAST:
    iVar1 = 1;
    __optname = 6;
    break;
  case ENET_SOCKOPT_RCVBUF:
    iVar1 = 1;
    __optname = 8;
    break;
  case ENET_SOCKOPT_SNDBUF:
    iVar1 = 1;
    __optname = 7;
    break;
  case ENET_SOCKOPT_REUSEADDR:
    iVar1 = 1;
    __optname = 2;
    break;
  case ENET_SOCKOPT_RCVTIMEO:
    __optname = 0x14;
    goto LAB_0015b826;
  case ENET_SOCKOPT_SNDTIMEO:
    __optname = 0x15;
LAB_0015b826:
    timeVal.tv_usec = (__suseconds_t)((value % 1000) * 1000);
    timeVal.tv_sec = (__time_t)(value / 1000);
    iVar1 = 1;
    __optval = &timeVal;
    __optlen = 0x10;
    goto LAB_0015b84d;
  default:
    goto switchD_0015b7b4_caseD_8;
  case ENET_SOCKOPT_NODELAY:
    iVar1 = 6;
    __optname = 1;
    break;
  case ENET_SOCKOPT_KEEPALIVE:
    iVar1 = 1;
    __optname = 9;
  }
  __optval = (timeval *)&value_local;
  __optlen = 4;
LAB_0015b84d:
  iVar1 = setsockopt(socket,iVar1,__optname,__optval,__optlen);
switchD_0015b7b4_caseD_8:
  return -(uint)(iVar1 == -1);
}

Assistant:

int
enet_socket_set_option (ENetSocket socket, ENetSocketOption option, int value)
{
    int result = -1;
    switch (option)
    {
        case ENET_SOCKOPT_NONBLOCK:
#ifdef HAS_FCNTL
            result = fcntl (socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl (socket, F_GETFL) & ~O_NONBLOCK));
#else
            result = ioctl (socket, FIONBIO, & value);
#endif
            break;

        case ENET_SOCKOPT_BROADCAST:
            result = setsockopt (socket, SOL_SOCKET, SO_BROADCAST, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_REUSEADDR:
            result = setsockopt (socket, SOL_SOCKET, SO_REUSEADDR, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_RCVBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_SNDBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_SNDBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_RCVTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_SNDTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_SNDTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_NODELAY:
            result = setsockopt (socket, IPPROTO_TCP, TCP_NODELAY, (char *) & value, sizeof (int));
            break;
        case ENET_SOCKOPT_KEEPALIVE:
            result = setsockopt (socket, SOL_SOCKET, SO_KEEPALIVE, (char *) & value, sizeof (int));
                  break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}